

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolverPMINRES.cpp
# Opt level: O2

double __thiscall chrono::ChSolverPMINRES::Solve(ChSolverPMINRES *this,ChSystemDescriptor *sysd)

{
  int *piVar1;
  double *scalar;
  Scalar SVar2;
  pointer ppCVar3;
  ChConstraint *pCVar4;
  pointer ppCVar5;
  ChVariables *this_00;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int iVar10;
  ChLog *pCVar11;
  ChStreamOutAscii *pCVar12;
  Scalar *pSVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  double dVar19;
  RealScalar RVar20;
  RealScalar RVar21;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar22 [64];
  undefined1 extraout_var [56];
  int nc;
  undefined1 local_238 [16];
  double local_220;
  ChVectorDynamic<> ml;
  double beta;
  ChVectorDynamic<> mz;
  ChVectorDynamic<> mr;
  ChVectorDynamic<> mp;
  ChVectorDynamic<> mNMr;
  ChVectorDynamic<> mNp;
  ChVectorDynamic<> mb;
  double alpha;
  ChVectorDynamic<> mDi;
  ChVectorDynamic<> mtmp;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_168;
  ChVectorDynamic<> mNMr_old;
  ChVectorDynamic<> mMNp;
  ChVectorDynamic<> mz_old;
  ChVectorDynamic<> mq;
  vector<double,_std::allocator<double>_> f_hist;
  undefined1 local_b8 [64];
  double gi_values [3];
  ChVectorRef local_48;
  
  if ((sysd->vstiffness).super__Vector_base<chrono::ChKblock_*,_std::allocator<chrono::ChKblock_*>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (sysd->vstiffness).super__Vector_base<chrono::ChKblock_*,_std::allocator<chrono::ChKblock_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    dVar19 = Solve_SupportingStiffness(this,sysd);
    return dVar19;
  }
  iVar10 = (*sysd->_vptr_ChSystemDescriptor[8])(sysd);
  nc = iVar10;
  if ((this->super_ChIterativeSolverVI).super_ChSolverVI.super_ChSolver.verbose == true) {
    pCVar11 = GetLog();
    pCVar12 = ChStreamOutAscii::operator<<
                        (&pCVar11->super_ChStreamOutAscii,"\n-----Projected MINRES, solving nc=");
    pCVar12 = ChStreamOutAscii::operator<<(pCVar12,iVar10);
    ChStreamOutAscii::operator<<(pCVar12,"unknowns \n");
  }
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&ml,&nc);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&mb,&nc);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&mp,&nc);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&mr,&nc);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&mz,&nc);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&mz_old,&nc);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&mNp,&nc);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&mMNp,&nc);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&mNMr,&nc);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&mNMr_old,&nc);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&mtmp,&nc);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&mDi,&nc);
  (this->super_ChIterativeSolverVI).m_iterations = 0;
  uVar15 = 0;
  while( true ) {
    ppCVar3 = (sysd->vconstraints).
              super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    uVar14 = (long)(sysd->vconstraints).
                   super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar3 >> 3;
    if (uVar14 <= uVar15) break;
    (*ppCVar3[uVar15]->_vptr_ChConstraint[6])();
    uVar15 = uVar15 + 1;
  }
  iVar10 = 0;
  auVar22 = ZEXT1664(ZEXT816(0x4008000000000000));
  uVar15 = 0xffffffff;
  while( true ) {
    uVar16 = uVar15;
    uVar15 = uVar16 + 1;
    if (uVar14 <= uVar15) break;
    pCVar4 = ppCVar3[uVar15];
    if (pCVar4->mode == CONSTRAINT_FRIC) {
      gi_values[iVar10] = pCVar4->g_i;
      iVar10 = iVar10 + 1;
      if (iVar10 == 3) {
        dVar19 = (gi_values[0] + gi_values[1] + gi_values[2]) / 3.0;
        ppCVar3[uVar16 - 1]->g_i = dVar19;
        iVar10 = 0;
        ppCVar3[uVar16]->g_i = dVar19;
        pCVar4->g_i = dVar19;
      }
    }
  }
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&mDi);
  iVar10 = 0;
  uVar15 = 0;
  while( true ) {
    ppCVar3 = (sysd->vconstraints).
              super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(sysd->vconstraints).
                      super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar3 >> 3) <=
        (ulong)uVar15) break;
    pCVar4 = ppCVar3[uVar15];
    if (pCVar4->active == true) {
      local_238._0_8_ = pCVar4->g_i;
      pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&mDi,
                           (long)iVar10,0);
      iVar10 = iVar10 + 1;
      auVar22 = ZEXT864((ulong)(1.0 / (double)local_238._0_8_));
      *pSVar13 = 1.0 / (double)local_238._0_8_;
    }
    uVar15 = uVar15 + 1;
  }
  uVar15 = 0;
  while( true ) {
    ppCVar5 = (sysd->vvariables).
              super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    uVar14 = (ulong)uVar15;
    if ((ulong)((long)(sysd->vvariables).
                      super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar5 >> 3) <= uVar14)
    break;
    this_00 = ppCVar5[uVar14];
    if (this_00->disabled == false) {
      ChVariables::Get_qb(&local_48,this_00);
      ChVariables::Get_fb((ChVectorRef *)&local_168,
                          (sysd->vvariables).
                          super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar14]);
      Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
      Ref<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>>
                ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)local_b8,
                 (RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                  *)&local_168);
      (*this_00->_vptr_ChVariables[4])
                (this_00,&local_48,
                 (Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)local_b8);
      Eigen::internal::handmade_aligned_free((void *)local_b8._24_8_);
    }
    uVar15 = uVar15 + 1;
  }
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&mb);
  iVar10 = 0;
  uVar15 = 0;
  while( true ) {
    auVar17 = auVar22._0_16_;
    ppCVar3 = (sysd->vconstraints).
              super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(sysd->vconstraints).
                      super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar3 >> 3) <=
        (ulong)uVar15) break;
    pCVar4 = ppCVar3[uVar15];
    if (pCVar4->active == true) {
      (*pCVar4->_vptr_ChConstraint[7])();
      local_238 = auVar17;
      pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&mb,
                           (long)iVar10,0);
      iVar10 = iVar10 + 1;
      auVar6._8_8_ = 0x8000000000000000;
      auVar6._0_8_ = 0x8000000000000000;
      auVar17 = vxorpd_avx512vl(local_238,auVar6);
      auVar22 = ZEXT1664(auVar17);
      SVar2 = (Scalar)vmovlpd_avx(auVar17);
      *pSVar13 = SVar2;
    }
    uVar15 = uVar15 + 1;
  }
  (*sysd->_vptr_ChSystemDescriptor[0xd])(sysd,&mtmp);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-=
            ((MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&mb,
             (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&mtmp);
  mq.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = (double *)0x0
  ;
  mq.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  (*sysd->_vptr_ChSystemDescriptor[0x10])(sysd,&mq,1);
  local_238._0_8_ = (this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_tolerance;
  local_220 = this->rel_tolerance;
  RVar20 = Eigen::internal::lpNorm_selector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::run
                     ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&mb);
  if ((this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_warm_start == true) {
    (*sysd->_vptr_ChSystemDescriptor[0x12])(sysd,&ml,1);
  }
  else {
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
              ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&ml);
  }
  (*sysd->_vptr_ChSystemDescriptor[0x16])(sysd,&mr,&ml,0);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
            ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
              *)local_b8,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&mb,
             (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&mr);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
            (&mr,(CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                  *)local_b8);
  scalar = &this->grad_diffstep;
  Eigen::operator*(&local_168,scalar,(StorageBaseType *)&mr);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+
            ((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)local_b8,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&ml,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&local_168);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
            (&mr,(CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)local_b8);
  (*sysd->_vptr_ChSystemDescriptor[0x18])(sysd,&mr);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
            ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
              *)&local_168,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&mr,
             (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&ml);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>
  ::operator/((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
               *)local_b8,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
               *)&local_168,scalar);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
            ((Matrix<double,__1,_1,_0,__1,_1> *)&mr,
             (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)local_b8);
  if ((this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_use_precond == true) {
    f_hist.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)&mDi;
    local_168._0_8_ = (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&mr;
    Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,-1,1,0,-1,1>>>::operator*
              ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)local_b8,
               (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_1,1,0,_1,1>>> *)&local_168,
               (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *)&f_hist);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,1,0,_1,1>>const,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,1,0,_1,1>>const>>
              (&mp,(CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    *)local_b8);
  }
  else {
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>(&mp,&mr);
  }
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>(&mz,&mp);
  (*sysd->_vptr_ChSystemDescriptor[0x16])(sysd,&mNMr,&mz,0);
  (*sysd->_vptr_ChSystemDescriptor[0x16])(sysd,&mNp,&mp,0);
  f_hist.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  uVar15 = 0;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = local_238._0_8_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = RVar20 * local_220;
  auVar17 = vmaxsd_avx(auVar18,auVar17);
  f_hist.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  f_hist.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  do {
    if ((this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_max_iterations <= (int)uVar15) {
LAB_00d141a9:
      (*sysd->_vptr_ChSystemDescriptor[0x13])(sysd,&ml);
      (*sysd->_vptr_ChSystemDescriptor[0x11])(sysd,&mq);
      uVar15 = 0;
      while( true ) {
        ppCVar3 = (sysd->vconstraints).
                  super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(sysd->vconstraints).
                          super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar3 >> 3) <=
            (ulong)uVar15) break;
        pCVar4 = ppCVar3[uVar15];
        if (pCVar4->active == true) {
          (*pCVar4->_vptr_ChConstraint[8])(pCVar4->l_i);
        }
        uVar15 = uVar15 + 1;
      }
      if ((this->super_ChIterativeSolverVI).super_ChSolverVI.super_ChSolver.verbose != false) {
        pCVar11 = GetLog();
        ChStreamOutAscii::operator<<(&pCVar11->super_ChStreamOutAscii,"-----\n");
      }
      local_238._0_8_ = this->r_proj_resid;
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&f_hist.super__Vector_base<double,_std::allocator<double>_>);
      Eigen::internal::handmade_aligned_free
                (mq.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data)
      ;
      Eigen::internal::handmade_aligned_free
                (mDi.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                );
      Eigen::internal::handmade_aligned_free
                (mtmp.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_data);
      Eigen::internal::handmade_aligned_free
                (mNMr_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_data);
      Eigen::internal::handmade_aligned_free
                (mNMr.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_data);
      Eigen::internal::handmade_aligned_free
                (mMNp.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_data);
      Eigen::internal::handmade_aligned_free
                (mNp.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                );
      Eigen::internal::handmade_aligned_free
                (mz_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_data);
      Eigen::internal::handmade_aligned_free
                (mz.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data)
      ;
      Eigen::internal::handmade_aligned_free
                (mr.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data)
      ;
      Eigen::internal::handmade_aligned_free
                (mp.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data)
      ;
      Eigen::internal::handmade_aligned_free
                (mb.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data)
      ;
      Eigen::internal::handmade_aligned_free
                (ml.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data)
      ;
      return (double)local_238._0_8_;
    }
    if ((this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_use_precond == true) {
      local_168._0_8_ = &mNp;
      alpha = (double)&mDi;
      Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,-1,1,0,-1,1>>>::operator*
                ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)local_b8,
                 (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_1,1,0,_1,1>>> *)&local_168,
                 (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *)&alpha)
      ;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,1,0,_1,1>>const,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,1,0,_1,1>>const>>
                (&mMNp,(CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        *)local_b8);
    }
    else {
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
                (&mMNp,&mNp);
    }
    local_220 = Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
                dot<Eigen::Matrix<double,_1,1,0,_1,1>>
                          ((MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&mz,
                           (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&mNMr);
    dVar19 = Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
             dot<Eigen::Matrix<double,_1,1,0,_1,1>>
                       ((MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&mMNp,
                        (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&mNp);
    local_238._8_8_ = extraout_XMM0_Qb;
    local_238._0_8_ = dVar19;
    auVar7._8_8_ = 0x7fffffffffffffff;
    auVar7._0_8_ = 0x7fffffffffffffff;
    auVar18 = vandpd_avx512vl(local_238,auVar7);
    if ((auVar18._0_8_ < 1e-29) &&
       (dVar19 = 1e-11,
       (this->super_ChIterativeSolverVI).super_ChSolverVI.super_ChSolver.verbose == true)) {
      pCVar11 = GetLog();
      pCVar12 = ChStreamOutAscii::operator<<(&pCVar11->super_ChStreamOutAscii,"Iter=");
      pCVar12 = ChStreamOutAscii::operator<<(pCVar12,uVar15);
      pCVar12 = ChStreamOutAscii::operator<<(pCVar12," Rayleigh quotient alpha breakdown: ");
      pCVar12 = ChStreamOutAscii::operator<<(pCVar12,local_220);
      pCVar12 = ChStreamOutAscii::operator<<(pCVar12," / ");
      pCVar12 = ChStreamOutAscii::operator<<(pCVar12,(double)local_238._0_8_);
      ChStreamOutAscii::operator<<(pCVar12,"\n");
      dVar19 = 1e-11;
    }
    alpha = local_220 / dVar19;
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                      *)local_b8,&alpha,(StorageBaseType *)&mp);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
              ((Matrix<double,__1,_1,_0,__1,_1> *)&mtmp,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                *)local_b8);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&ml,
               (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&mtmp);
    local_220 = Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::norm
                          ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&mtmp);
    (*sysd->_vptr_ChSystemDescriptor[0x18])(sysd,&ml);
    (*sysd->_vptr_ChSystemDescriptor[0x16])
              (sysd,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&mr,&ml,0);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
              ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                *)local_b8,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&mb,
               (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&mr);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
              ((Matrix<double,__1,_1,_0,__1,_1> *)&mr,
               (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                *)local_b8);
    Eigen::operator*(&local_168,scalar,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&mr);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+
              ((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)local_b8,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&ml,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)&local_168);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
              ((Matrix<double,__1,_1,_0,__1,_1> *)&mr,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)local_b8);
    (*sysd->_vptr_ChSystemDescriptor[0x18])
              (sysd,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&mr);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
              ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                *)&local_168,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&mr,
               (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&ml);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>
    ::operator/((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                 *)local_b8,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                 *)&local_168,scalar);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
              ((Matrix<double,__1,_1,_0,__1,_1> *)&mr,
               (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)local_b8);
    piVar1 = &(this->super_ChIterativeSolverVI).m_iterations;
    *piVar1 = *piVar1 + 1;
    RVar21 = Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::norm
                       ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&mr);
    this->r_proj_resid = RVar21;
    if (RVar21 < auVar17._0_8_) {
      if ((this->super_ChIterativeSolverVI).super_ChSolverVI.super_ChSolver.verbose == true) {
        pCVar11 = GetLog();
        pCVar12 = ChStreamOutAscii::operator<<(&pCVar11->super_ChStreamOutAscii,"Iter=");
        pCVar12 = ChStreamOutAscii::operator<<(pCVar12,uVar15);
        pCVar12 = ChStreamOutAscii::operator<<(pCVar12," P(r)-converged!  |P(r)|=");
        pCVar12 = ChStreamOutAscii::operator<<(pCVar12,this->r_proj_resid);
        ChStreamOutAscii::operator<<(pCVar12,"\n");
      }
      goto LAB_00d141a9;
    }
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
              (&mz_old,&mz);
    if ((this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_use_precond == true) {
      beta = (double)&mDi;
      local_168._0_8_ = (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&mr;
      Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,-1,1,0,-1,1>>>::operator*
                ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)local_b8,
                 (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_1,1,0,_1,1>>> *)&local_168,
                 (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *)&beta);
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,1,0,_1,1>>const,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,1,0,_1,1>>const>>
                (&mz,(CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      *)local_b8);
    }
    else {
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
                (&mz,(Matrix<double,__1,_1,_0,__1,_1> *)&mr);
    }
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
              (&mNMr_old,&mNMr);
    (*sysd->_vptr_ChSystemDescriptor[0x16])(sysd,&mNMr,&mz);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
              ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                *)local_b8,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&mNMr,
               (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&mNMr_old);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
              ((Matrix<double,__1,_1,_0,__1,_1> *)&mtmp,
               (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                *)local_b8);
    local_238._0_8_ =
         Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
         dot<Eigen::Matrix<double,_1,1,0,_1,1>>
                   ((MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&mz,
                    (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&mtmp);
    local_238._8_8_ = extraout_XMM0_Qb_00;
    auVar22._0_8_ =
         Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
         dot<Eigen::Matrix<double,_1,1,0,_1,1>>
                   ((MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&mz_old,
                    (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&mNMr_old);
    auVar22._8_56_ = extraout_var;
    beta = local_238._0_8_ / auVar22._0_8_;
    auVar8._8_8_ = 0x7fffffffffffffff;
    auVar8._0_8_ = 0x7fffffffffffffff;
    auVar18 = vandpd_avx(local_238,auVar8);
    if ((auVar18._0_8_ < 1e-29) ||
       (auVar9._8_8_ = 0x7fffffffffffffff, auVar9._0_8_ = 0x7fffffffffffffff,
       auVar18 = vandpd_avx(auVar22._0_16_,auVar9), auVar18._0_8_ < 1e-29)) {
      if ((this->super_ChIterativeSolverVI).super_ChSolverVI.super_ChSolver.verbose == true) {
        pCVar11 = GetLog();
        pCVar12 = ChStreamOutAscii::operator<<(&pCVar11->super_ChStreamOutAscii,"Iter=");
        pCVar12 = ChStreamOutAscii::operator<<(pCVar12,uVar15);
        pCVar12 = ChStreamOutAscii::operator<<(pCVar12," Ribiere quotient beta restart: ");
        pCVar12 = ChStreamOutAscii::operator<<(pCVar12,(double)local_238._0_8_);
        pCVar12 = ChStreamOutAscii::operator<<(pCVar12," / ");
        pCVar12 = ChStreamOutAscii::operator<<(pCVar12,auVar22._0_8_);
        ChStreamOutAscii::operator<<(pCVar12,"\n");
      }
      beta = 0.0;
    }
    Eigen::operator*(&local_168,&beta,(StorageBaseType *)&mp);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+
              ((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)local_b8,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&mz,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)&local_168);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
              (&mp,(CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    *)local_b8);
    Eigen::operator*(&local_168,&beta,(StorageBaseType *)&mNp);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+
              ((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)local_b8,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&mNMr,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)&local_168);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
              (&mNp,(CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                     *)local_b8);
    if ((this->super_ChIterativeSolverVI).record_violation_history == true) {
      ChIterativeSolverVI::AtIterationEnd
                (&this->super_ChIterativeSolverVI,this->r_proj_resid,local_220,uVar15);
    }
    uVar15 = uVar15 + 1;
  } while( true );
}

Assistant:

double ChSolverPMINRES::Solve(ChSystemDescriptor& sysd) {
    std::vector<ChConstraint*>& mconstraints = sysd.GetConstraintsList();
    std::vector<ChVariables*>& mvariables = sysd.GetVariablesList();

    // If stiffness blocks are used, the Schur complement cannot be esily
    // used, so fall back to the Solve_SupportingStiffness method, that operates on KKT.
    if (sysd.GetKblocksList().size() > 0)
        return this->Solve_SupportingStiffness(sysd);

    // Allocate auxiliary vectors;

    int nc = sysd.CountActiveConstraints();
    if (verbose)
        GetLog() << "\n-----Projected MINRES, solving nc=" << nc << "unknowns \n";

    ChVectorDynamic<> ml(nc);
    ChVectorDynamic<> mb(nc);
    ChVectorDynamic<> mp(nc);
    ChVectorDynamic<> mr(nc);
    ChVectorDynamic<> mz(nc);
    ChVectorDynamic<> mz_old(nc);
    ChVectorDynamic<> mNp(nc);
    ChVectorDynamic<> mMNp(nc);
    ChVectorDynamic<> mNMr(nc);
    ChVectorDynamic<> mNMr_old(nc);
    ChVectorDynamic<> mtmp(nc);
    ChVectorDynamic<> mDi(nc);

    m_iterations = 0;

    // Update auxiliary data in all constraints before starting,
    // that is: g_i=[Cq_i]*[invM_i]*[Cq_i]' and  [Eq_i]=[invM_i]*[Cq_i]'
    for (unsigned int ic = 0; ic < mconstraints.size(); ic++)
        mconstraints[ic]->Update_auxiliary();

    // Average all g_i for the triplet of contact constraints n,u,v.
    //  Can be used as diagonal preconditioner.
    int j_friction_comp = 0;
    double gi_values[3];
    for (unsigned int ic = 0; ic < mconstraints.size(); ic++) {
        if (mconstraints[ic]->GetMode() == CONSTRAINT_FRIC) {
            gi_values[j_friction_comp] = mconstraints[ic]->Get_g_i();
            j_friction_comp++;
            if (j_friction_comp == 3) {
                double average_g_i = (gi_values[0] + gi_values[1] + gi_values[2]) / 3.0;
                mconstraints[ic - 2]->Set_g_i(average_g_i);
                mconstraints[ic - 1]->Set_g_i(average_g_i);
                mconstraints[ic - 0]->Set_g_i(average_g_i);
                j_friction_comp = 0;
            }
        }
    }

    // The vector with the inverse of diagonal of the N matrix
    mDi.setZero();
    int d_i = 0;
    for (unsigned int ic = 0; ic < mconstraints.size(); ic++)
        if (mconstraints[ic]->IsActive()) {
            mDi(d_i, 0) = 1.0 / mconstraints[ic]->Get_g_i();
            ++d_i;
        }

    // ***TO DO*** move the following thirty lines in a short function ChSystemDescriptor::ShurBvectorCompute() ?

    // Compute the b_shur vector in the Shur complement equation N*l = b_shur
    // with
    //   N_shur  = D'* (M^-1) * D
    //   b_shur  = - c + D'*(M^-1)*k = b_i + D'*(M^-1)*k
    // but flipping the sign of lambdas,  b_shur = - b_i - D'*(M^-1)*k
    // Do this in three steps:

    // Put (M^-1)*k    in  q  sparse vector of each variable..
    for (unsigned int iv = 0; iv < mvariables.size(); iv++)
        if (mvariables[iv]->IsActive())
            mvariables[iv]->Compute_invMb_v(mvariables[iv]->Get_qb(), mvariables[iv]->Get_fb());  // q = [M]'*fb

    // ...and now do  b_shur = - D' * q  ..
    mb.setZero();
    int s_i = 0;
    for (unsigned int ic = 0; ic < mconstraints.size(); ic++)
        if (mconstraints[ic]->IsActive()) {
            mb(s_i, 0) = -mconstraints[ic]->Compute_Cq_q();
            ++s_i;
        }

    // ..and finally do   b_shur = b_shur - c
    sysd.BuildBiVector(mtmp);  // b_i   =   -c   = phi/h
    mb -= mtmp;

    // Optimization: backup the  q  sparse data computed above,
    // because   (M^-1)*k   will be needed at the end when computing primals.
    ChVectorDynamic<> mq;
    sysd.FromVariablesToVector(mq, true);

    double rel_tol = this->rel_tolerance;
    double abs_tol = m_tolerance;
    double rel_tol_b = mb.lpNorm<Eigen::Infinity>() * rel_tol;

    // Initialize lambdas
    if (m_warm_start)
        sysd.FromConstraintsToVector(ml);
    else
        ml.setZero();

    // Initial projection of ml   ***TO DO***?
    // ...

    // r = b - N*l;
    sysd.ShurComplementProduct(mr, ml);  // r = N*l
    mr = mb - mr;                        // r =-N*l+b

    // r = (project_orthogonal(l+diff*r, fric) - l)/diff;
    mr = ml + grad_diffstep * mr;    // r = l + diff*r
    sysd.ConstraintsProject(mr);     // r = P(l + diff*r) ...
    mr = (mr - ml) / grad_diffstep;  // r = (P(l + diff*r) - l)/diff

    // p = Mi * r;
    if (m_use_precond)
        mp = mr.array() * mDi.array();
    else
        mp = mr;

    // z = Mi * r;
    mz = mp;

    // NMr = N*M*r = N*z
    sysd.ShurComplementProduct(mNMr, mz);  // NMr = N*z

    // Np = N*p
    sysd.ShurComplementProduct(mNp, mp);  // Np = N*p

    //// RADU
    //// Is the above correct?  We always have z=p and therefore NMr = Np...

    //
    // THE LOOP
    //

    std::vector<double> f_hist;

    for (int iter = 0; iter < m_max_iterations; iter++) {
        // MNp = Mi*Np; % = Mi*N*p                  %% -- Precond
        if (m_use_precond)
            mMNp = mNp.array() * mDi.array();
        else
            mMNp = mNp;

        // alpha = (z'*(NMr))/((MNp)'*(Np));
        double zNMr = mz.dot(mNMr);    // zMNr = z'* NMr
        double MNpNp = mMNp.dot(mNp);  //  MNpNp = ((MNp)'*(Np))

        if (fabs(MNpNp) < 10e-30) {
            if (verbose)
                GetLog() << "Iter=" << iter << " Rayleigh quotient alpha breakdown: " << zNMr << " / " << MNpNp << "\n";
            MNpNp = 10e-12;
        }

        double alpha = zNMr / MNpNp;  // alpha = (z'*(NMr))/((MNp)'*(Np));

        // l = l + alpha * p;
        mtmp = alpha * mp;
        ml += mtmp;

        double maxdeltalambda = mtmp.norm();  //***better infinity norm for speed reasons?

        // l = Proj(l)
        sysd.ConstraintsProject(ml);  // l = P(l)

        // r = b - N*l;
        sysd.ShurComplementProduct(mr, ml);  // r = N*l
        mr = mb - mr;                        // r =-N*l+b

        // r = (project_orthogonal(l+diff*r, fric) - l)/diff;
        mr = ml + grad_diffstep * mr;
        sysd.ConstraintsProject(mr);     // r = P(l+diff*r)
        mr = (mr - ml) / grad_diffstep;  // r = (P(l+diff*r)-l)/diff

        m_iterations++;

        // Terminate iteration when the projected r is small, if (norm(r,2) <= max(rel_tol_b,abs_tol))
        r_proj_resid = mr.norm();
        if (r_proj_resid < ChMax(rel_tol_b, abs_tol)) {
            if (verbose)
                GetLog() << "Iter=" << iter << " P(r)-converged!  |P(r)|=" << r_proj_resid << "\n";
            break;
        }

        // z_old = z;
        mz_old = mz;

        // z = Mi*r;                                 %% -- Precond
        if (m_use_precond)
            mz = mr.array() * mDi.array();
        else
            mz = mr;

        // NMr_old = NMr;
        mNMr_old = mNMr;

        // NMr = N*z;
        sysd.ShurComplementProduct(mNMr, mz);  // NMr = N*z

        // beta = z'*(NMr-NMr_old)/(z_old'*(NMr_old));
        mtmp = mNMr - mNMr_old;
        double numerator = mz.dot(mtmp);
        double denominator = mz_old.dot(mNMr_old);
        double beta = numerator / denominator;

        // Robustness improver: restart if beta=0 or too large
        if (fabs(denominator) < 10e-30 || fabs(numerator) < 10e-30) {
            if (verbose)
                GetLog() << "Iter=" << iter << " Ribiere quotient beta restart: " << numerator << " / " << denominator
                         << "\n";
            beta = 0;
        }

        // beta = ChMax(0.0, beta); //***NOT NEEDED!!! (may be negative in not positive def.matrices!)

        // p = z + beta * p;
        mp = mz + beta * mp;

        // Np = NMr + beta*Np;   // Optimization!! avoid matr x vect!!! (if no 'p' projection has been done)
        mNp = mNMr + beta * mNp;

        // ---------------------------------------------
        // METRICS - convergence, plots, etc

        // For recording into correction/residuals/violation history, if debugging
        if (this->record_violation_history)
            AtIterationEnd(r_proj_resid, maxdeltalambda, iter);
    }

    // Resulting DUAL variables:
    // store ml temporary vector into ChConstraint 'l_i' multipliers
    sysd.FromVectorToConstraints(ml);

    // Resulting PRIMAL variables:
    // compute the primal variables as   v = (M^-1)(k + D*l)

    // v = (M^-1)*k  ...    (by rewinding to the backup vector computed ad the beginning)
    sysd.FromVectorToVariables(mq);

    // ... + (M^-1)*D*l     (this increment and also stores 'qb' in the ChVariable items)
    for (unsigned int ic = 0; ic < mconstraints.size(); ic++) {
        if (mconstraints[ic]->IsActive())
            mconstraints[ic]->Increment_q(mconstraints[ic]->Get_l_i());
    }

    if (verbose)
        GetLog() << "-----\n";

    return r_proj_resid;
}